

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O0

void Assimp::IFC::ProcessSweptAreaSolid
               (IfcSweptAreaSolid *swept,TempMesh *meshout,ConversionData *conv)

{
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  format local_1a8;
  IfcRevolvedAreaSolid *local_30;
  IfcRevolvedAreaSolid *rev;
  IfcExtrudedAreaSolid *solid;
  ConversionData *conv_local;
  TempMesh *meshout_local;
  IfcSweptAreaSolid *swept_local;
  
  solid = (IfcExtrudedAreaSolid *)conv;
  conv_local = (ConversionData *)meshout;
  meshout_local = (TempMesh *)swept;
  rev = (IfcRevolvedAreaSolid *)
        STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcExtrudedAreaSolid>
                  ((Object *)
                   ((long)&(swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                           super_IfcRepresentationItem.
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           _vptr_ObjectHelper +
                   (long)(swept->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                         super_IfcRepresentationItem.
                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                         _vptr_ObjectHelper[-3]));
  if (rev == (IfcRevolvedAreaSolid *)0x0) {
    local_30 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcRevolvedAreaSolid>
                         ((Object *)
                          ((long)&(meshout_local->mVerts).
                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                          (long)(meshout_local->mVerts).
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].x));
    if (local_30 == (IfcRevolvedAreaSolid *)0x0) {
      STEP::Object::GetClassName_abi_cxx11_
                (&local_1e8,
                 (Object *)
                 ((long)&(meshout_local->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                 (long)(meshout_local->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[-1].x));
      std::operator+(&local_1c8,"skipping unknown IfcSweptAreaSolid entity, type is ",&local_1e8);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1a8,
                 &local_1c8);
      LogFunctions<Assimp::IFCImporter>::LogWarn(&local_1a8);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    else {
      ProcessRevolvedAreaSolid(local_30,(TempMesh *)conv_local,(ConversionData *)solid);
    }
  }
  else {
    ProcessExtrudedAreaSolid
              ((IfcExtrudedAreaSolid *)rev,(TempMesh *)conv_local,(ConversionData *)solid,
               *(long *)&solid[2].super_IfcSweptAreaSolid.super_IfcSolidModel.field_0x40 != 0);
  }
  return;
}

Assistant:

void ProcessSweptAreaSolid(const Schema_2x3::IfcSweptAreaSolid& swept, TempMesh& meshout,
    ConversionData& conv)
{
    if(const Schema_2x3::IfcExtrudedAreaSolid* const solid = swept.ToPtr<Schema_2x3::IfcExtrudedAreaSolid>()) {
        ProcessExtrudedAreaSolid(*solid,meshout,conv, !!conv.collect_openings);
    }
    else if(const Schema_2x3::IfcRevolvedAreaSolid* const rev = swept.ToPtr<Schema_2x3::IfcRevolvedAreaSolid>()) {
        ProcessRevolvedAreaSolid(*rev,meshout,conv);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcSweptAreaSolid entity, type is " + swept.GetClassName());
    }
}